

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [16],char **RestArgs,char (*RestArgs_1) [7],char **RestArgs_2,
               char (*RestArgs_3) [15],char (*RestArgs_4) [23],char **RestArgs_5,
               char (*RestArgs_6) [35],char **RestArgs_7,char (*RestArgs_8) [71],char **RestArgs_9,
               char (*RestArgs_10) [73])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8,RestArgs_9,RestArgs_10);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}